

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger-inl.h
# Opt level: O2

void __thiscall
spdlog::logger::set_formatter
          (logger *this,unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *f)

{
  pointer psVar1;
  element_type *peVar2;
  pointer psVar3;
  pointer *__ptr;
  long *local_38;
  formatter *local_30;
  
  psVar3 = (this->sinks_).
           super__Vector_base<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    psVar1 = (this->sinks_).
             super__Vector_base<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar3 == psVar1) {
      return;
    }
    peVar2 = (psVar3->super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (psVar3 + 1 == psVar1) break;
    (*((f->_M_t).super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>.
       _M_t.super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
       super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl)->_vptr_formatter[3])
              (&local_38);
    (*peVar2->_vptr_sink[5])(peVar2,&local_38);
    if (local_38 != (long *)0x0) {
      (**(code **)(*local_38 + 8))();
    }
    local_38 = (long *)0x0;
    psVar3 = psVar3 + 1;
  }
  local_30 = (f->_M_t).
             super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
             super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
             super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl;
  (f->_M_t).super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
  super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
  super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl = (formatter *)0x0;
  (*peVar2->_vptr_sink[5])(peVar2);
  if (local_30 == (formatter *)0x0) {
    return;
  }
  (*local_30->_vptr_formatter[1])();
  return;
}

Assistant:

SPDLOG_INLINE void logger::set_formatter(std::unique_ptr<formatter> f)
{
    for (auto it = sinks_.begin(); it != sinks_.end(); ++it)
    {
        if (std::next(it) == sinks_.end())
        {
            // last element - we can be move it.
            (*it)->set_formatter(std::move(f));
            break; // to prevent clang-tidy warning
        }
        else
        {
            (*it)->set_formatter(f->clone());
        }
    }
}